

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_extract_secret
              (secp256k1_context *ctx,uchar *adaptor_secret32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig65,secp256k1_pubkey *adaptor)

{
  int iVar1;
  undefined1 local_1d0 [8];
  secp256k1_pubkey adaptor_expected;
  secp256k1_gej adaptor_expected_gej;
  secp256k1_ge adaptor_expected_ge;
  secp256k1_scalar adaptor_secret;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_pubkey *adaptor_local;
  uchar *adaptor_sig65_local;
  secp256k1_ecdsa_signature *sig_local;
  uchar *adaptor_secret32_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_secret32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig65 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)0x0,(secp256k1_scalar *)0x0,(secp256k1_scalar *)(s.d + 3),
                       adaptor_sig65);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_ecdsa_signature_load
                (ctx,(secp256k1_scalar *)(adaptor_secret.d + 3),(secp256k1_scalar *)(r.d + 3),sig);
      secp256k1_scalar_inverse
                ((secp256k1_scalar *)&adaptor_expected_ge.infinity,(secp256k1_scalar *)(r.d + 3));
      secp256k1_scalar_mul
                ((secp256k1_scalar *)&adaptor_expected_ge.infinity,
                 (secp256k1_scalar *)&adaptor_expected_ge.infinity,(secp256k1_scalar *)(s.d + 3));
      secp256k1_ecmult_gen
                (&ctx->ecmult_gen_ctx,(secp256k1_gej *)(adaptor_expected.data + 0x38),
                 (secp256k1_scalar *)&adaptor_expected_ge.infinity);
      secp256k1_ge_set_gej
                ((secp256k1_ge *)&adaptor_expected_gej.infinity,
                 (secp256k1_gej *)(adaptor_expected.data + 0x38));
      secp256k1_pubkey_save
                ((secp256k1_pubkey *)local_1d0,(secp256k1_ge *)&adaptor_expected_gej.infinity);
      iVar1 = memcmp(local_1d0,adaptor,0x40);
      if (iVar1 != 0) {
        secp256k1_scalar_negate
                  ((secp256k1_scalar *)&adaptor_expected_ge.infinity,
                   (secp256k1_scalar *)&adaptor_expected_ge.infinity);
      }
      secp256k1_scalar_get_b32(adaptor_secret32,(secp256k1_scalar *)&adaptor_expected_ge.infinity);
      secp256k1_scalar_clear((secp256k1_scalar *)&adaptor_expected_ge.infinity);
      secp256k1_scalar_clear((secp256k1_scalar *)(s.d + 3));
      secp256k1_scalar_clear((secp256k1_scalar *)(r.d + 3));
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_extract_secret(const secp256k1_context* ctx, unsigned char *adaptor_secret32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig65, const secp256k1_pubkey *adaptor) {
    secp256k1_scalar sp;
    secp256k1_scalar s, r;
    secp256k1_scalar adaptor_secret;
    secp256k1_ge adaptor_expected_ge;
    secp256k1_gej adaptor_expected_gej;
    secp256k1_pubkey adaptor_expected;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, NULL, &sp, adaptor_sig65)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_inverse(&adaptor_secret, &s);
    secp256k1_scalar_mul(&adaptor_secret, &adaptor_secret, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &adaptor_expected_gej, &adaptor_secret);
    secp256k1_ge_set_gej(&adaptor_expected_ge, &adaptor_expected_gej);
    secp256k1_pubkey_save(&adaptor_expected, &adaptor_expected_ge);
    if (memcmp(&adaptor_expected, adaptor, sizeof(adaptor_expected)) != 0) {
        secp256k1_scalar_negate(&adaptor_secret, &adaptor_secret);
    }
    secp256k1_scalar_get_b32(adaptor_secret32, &adaptor_secret);

    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}